

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns.c
# Opt level: O0

void PrintOutputS(N_Vector *uS)

{
  undefined8 *puVar1;
  undefined8 *in_RDI;
  sunrealtype *sdata;
  
  puVar1 = (undefined8 *)N_VGetArrayPointer(*in_RDI);
  printf("                  Sensitivity 1  ");
  printf("%12.4e %12.4e %12.4e \n",*puVar1,puVar1[1],puVar1[2]);
  puVar1 = (undefined8 *)N_VGetArrayPointer(in_RDI[1]);
  printf("                  Sensitivity 2  ");
  printf("%12.4e %12.4e %12.4e \n",*puVar1,puVar1[1],puVar1[2]);
  puVar1 = (undefined8 *)N_VGetArrayPointer(in_RDI[2]);
  printf("                  Sensitivity 3  ");
  printf("%12.4e %12.4e %12.4e \n",*puVar1,puVar1[1],puVar1[2]);
  return;
}

Assistant:

static void PrintOutputS(N_Vector* uS)
{
  sunrealtype* sdata;

  sdata = N_VGetArrayPointer(uS[0]);
  printf("                  Sensitivity 1  ");

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le %12.4Le \n", sdata[0], sdata[1], sdata[2]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#else
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#endif

  sdata = N_VGetArrayPointer(uS[1]);
  printf("                  Sensitivity 2  ");

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le %12.4Le \n", sdata[0], sdata[1], sdata[2]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#else
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#endif

  sdata = N_VGetArrayPointer(uS[2]);
  printf("                  Sensitivity 3  ");

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le %12.4Le \n", sdata[0], sdata[1], sdata[2]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#else
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#endif
}